

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3_randomness(int N,void *pBuf)

{
  byte bVar1;
  int iVar2;
  sqlite3_mutex *psVar3;
  sqlite3_vfs *psVar4;
  long lVar5;
  bool bVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  uchar uVar22;
  char k [256];
  char local_128 [256];
  
  iVar2 = sqlite3_initialize();
  if (iVar2 != 0) {
    return;
  }
  if (sqlite3Config.bCoreMutex == 0) {
    if (N < 1 || pBuf == (void *)0x0) {
      sqlite3Prng.isInit = '\0';
      return;
    }
    bVar6 = true;
    psVar3 = (sqlite3_mutex *)0x0;
  }
  else {
    psVar3 = (*sqlite3Config.mutex.xMutexAlloc)(5);
    bVar6 = psVar3 == (sqlite3_mutex *)0x0;
    if (bVar6) {
      if (pBuf == (void *)0x0 || N < 1) {
        sqlite3Prng.isInit = '\0';
        return;
      }
    }
    else {
      (*sqlite3Config.mutex.xMutexEnter)(psVar3);
      if (pBuf == (void *)0x0 || N < 1) {
        sqlite3Prng.isInit = '\0';
        (*sqlite3Config.mutex.xMutexLeave)(psVar3);
        return;
      }
      bVar6 = false;
    }
  }
  if (sqlite3Prng.isInit == '\0') {
    sqlite3Prng.i = '\0';
    sqlite3Prng.j = '\0';
    lVar5 = 0;
    psVar4 = sqlite3_vfs_find((char *)0x0);
    (*psVar4->xRandomness)(psVar4,0x100,local_128);
    uVar7 = '\0';
    uVar8 = '\x01';
    uVar9 = '\x02';
    uVar10 = '\x03';
    uVar11 = '\x04';
    uVar12 = '\x05';
    uVar13 = '\x06';
    uVar14 = '\a';
    uVar15 = '\b';
    uVar16 = '\t';
    uVar17 = '\n';
    uVar18 = '\v';
    uVar19 = '\f';
    uVar20 = '\r';
    uVar21 = '\x0e';
    uVar22 = '\x0f';
    do {
      sqlite3Prng.s[lVar5] = uVar7;
      sqlite3Prng.s[lVar5 + 1] = uVar8;
      sqlite3Prng.s[lVar5 + 2] = uVar9;
      sqlite3Prng.s[lVar5 + 3] = uVar10;
      sqlite3Prng.s[lVar5 + 4] = uVar11;
      sqlite3Prng.s[lVar5 + 5] = uVar12;
      sqlite3Prng.s[lVar5 + 6] = uVar13;
      sqlite3Prng.s[lVar5 + 7] = uVar14;
      sqlite3Prng.s[lVar5 + 8] = uVar15;
      sqlite3Prng.s[lVar5 + 9] = uVar16;
      sqlite3Prng.s[lVar5 + 10] = uVar17;
      sqlite3Prng.s[lVar5 + 0xb] = uVar18;
      sqlite3Prng.s[lVar5 + 0xc] = uVar19;
      sqlite3Prng.s[lVar5 + 0xd] = uVar20;
      sqlite3Prng.s[lVar5 + 0xe] = uVar21;
      sqlite3Prng.s[lVar5 + 0xf] = uVar22;
      lVar5 = lVar5 + 0x10;
      uVar7 = uVar7 + '\x10';
      uVar8 = uVar8 + '\x10';
      uVar9 = uVar9 + '\x10';
      uVar10 = uVar10 + '\x10';
      uVar11 = uVar11 + '\x10';
      uVar12 = uVar12 + '\x10';
      uVar13 = uVar13 + '\x10';
      uVar14 = uVar14 + '\x10';
      uVar15 = uVar15 + '\x10';
      uVar16 = uVar16 + '\x10';
      uVar17 = uVar17 + '\x10';
      uVar18 = uVar18 + '\x10';
      uVar19 = uVar19 + '\x10';
      uVar20 = uVar20 + '\x10';
      uVar21 = uVar21 + '\x10';
      uVar22 = uVar22 + '\x10';
    } while (lVar5 != 0x100);
    lVar5 = 0;
    bVar1 = sqlite3Prng.j;
    do {
      bVar1 = bVar1 + local_128[lVar5] + sqlite3Prng.s[lVar5];
      uVar7 = sqlite3Prng.s[bVar1];
      sqlite3Prng.s[bVar1] = sqlite3Prng.s[lVar5];
      sqlite3Prng.s[lVar5] = uVar7;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x100);
    sqlite3Prng.isInit = '\x01';
  }
  else {
    bVar1 = sqlite3Prng.j;
  }
  lVar5 = 0;
  do {
    sqlite3Prng.i = sqlite3Prng.i + 1;
    uVar7 = sqlite3Prng.s[sqlite3Prng.i];
    bVar1 = bVar1 + uVar7;
    sqlite3Prng.s[sqlite3Prng.i] = sqlite3Prng.s[bVar1];
    sqlite3Prng.s[bVar1] = uVar7;
    *(uchar *)((long)pBuf + lVar5) = sqlite3Prng.s[(byte)(uVar7 + sqlite3Prng.s[sqlite3Prng.i])];
    lVar5 = lVar5 + 1;
  } while (N != (int)lVar5);
  sqlite3Prng.j = bVar1;
  if (!bVar6) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar3);
  }
  return;
}

Assistant:

SQLITE_API void sqlite3_randomness(int N, void *pBuf){
  unsigned char t;
  unsigned char *zBuf = pBuf;

  /* The "wsdPrng" macro will resolve to the pseudo-random number generator
  ** state vector.  If writable static data is unsupported on the target,
  ** we have to locate the state vector at run-time.  In the more common
  ** case where writable static data is supported, wsdPrng can refer directly
  ** to the "sqlite3Prng" state vector declared above.
  */
#ifdef SQLITE_OMIT_WSD
  struct sqlite3PrngType *p = &GLOBAL(struct sqlite3PrngType, sqlite3Prng);
# define wsdPrng p[0]
#else
# define wsdPrng sqlite3Prng
#endif

#if SQLITE_THREADSAFE
  sqlite3_mutex *mutex;
#endif

#ifndef SQLITE_OMIT_AUTOINIT
  if( sqlite3_initialize() ) return;
#endif

#if SQLITE_THREADSAFE
  mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_PRNG);
#endif

  sqlite3_mutex_enter(mutex);
  if( N<=0 || pBuf==0 ){
    wsdPrng.isInit = 0;
    sqlite3_mutex_leave(mutex);
    return;
  }

  /* Initialize the state of the random number generator once,
  ** the first time this routine is called.  The seed value does
  ** not need to contain a lot of randomness since we are not
  ** trying to do secure encryption or anything like that...
  **
  ** Nothing in this file or anywhere else in SQLite does any kind of
  ** encryption.  The RC4 algorithm is being used as a PRNG (pseudo-random
  ** number generator) not as an encryption device.
  */
  if( !wsdPrng.isInit ){
    int i;
    char k[256];
    wsdPrng.j = 0;
    wsdPrng.i = 0;
    sqlite3OsRandomness(sqlite3_vfs_find(0), 256, k);
    for(i=0; i<256; i++){
      wsdPrng.s[i] = (u8)i;
    }
    for(i=0; i<256; i++){
      wsdPrng.j += wsdPrng.s[i] + k[i];
      t = wsdPrng.s[wsdPrng.j];
      wsdPrng.s[wsdPrng.j] = wsdPrng.s[i];
      wsdPrng.s[i] = t;
    }
    wsdPrng.isInit = 1;
  }

  assert( N>0 );
  do{
    wsdPrng.i++;
    t = wsdPrng.s[wsdPrng.i];
    wsdPrng.j += t;
    wsdPrng.s[wsdPrng.i] = wsdPrng.s[wsdPrng.j];
    wsdPrng.s[wsdPrng.j] = t;
    t += wsdPrng.s[wsdPrng.i];
    *(zBuf++) = wsdPrng.s[t];
  }while( --N );
  sqlite3_mutex_leave(mutex);
}